

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyprivate.h
# Opt level: O2

void __thiscall
QPropertyObserver::QPropertyObserver(QPropertyObserver *this,QPropertyObserver *other)

{
  anon_union_8_3_f4808d2f_for_QPropertyObserverBase_3 aVar1;
  ulong uVar2;
  ulong *puVar3;
  
  (this->super_QPropertyObserverBase).next.d = 0;
  (this->super_QPropertyObserverBase).prev.d = (quintptr *)0x0;
  (this->super_QPropertyObserverBase).field_2.binding = (QPropertyBindingPrivate *)0x0;
  aVar1 = (other->super_QPropertyObserverBase).field_2;
  (other->super_QPropertyObserverBase).field_2.binding = (QPropertyBindingPrivate *)0x0;
  (this->super_QPropertyObserverBase).field_2 = aVar1;
  uVar2 = (other->super_QPropertyObserverBase).next.d;
  (other->super_QPropertyObserverBase).next.d = 0;
  (this->super_QPropertyObserverBase).next.d = uVar2;
  puVar3 = (other->super_QPropertyObserverBase).prev.d;
  (other->super_QPropertyObserverBase).prev.d = (quintptr *)0x0;
  (this->super_QPropertyObserverBase).prev.d = puVar3;
  if (7 < uVar2) {
    *(QPropertyObserver **)((uVar2 & 0xfffffffffffffff8) + 8) = this;
    puVar3 = (this->super_QPropertyObserverBase).prev.d;
  }
  if (puVar3 != (ulong *)0x0) {
    *puVar3 = (ulong)((uint)*puVar3 & 7) | (ulong)this;
  }
  return;
}

Assistant:

QTagPreservingPointerToPointer(T **ptr)
        : d(reinterpret_cast<quintptr*>(ptr))
    {}